

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
          *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  ulong uVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar3;
  char __tmp;
  ulong uVar4;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar5;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar10 = (ulong)spec->width_;
  uVar7 = f->size_;
  lVar11 = uVar7 - uVar10;
  if (uVar10 <= uVar7) {
LAB_001582ce:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  uVar13 = uVar10 - uVar7;
  if (spec->align_ == ALIGN_CENTER) {
    uVar12 = uVar13 >> 1;
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    bVar6 = this[0x18];
    uVar8 = uVar4;
    uVar9 = uVar12;
    bVar5 = bVar6;
    if (1 < uVar13) {
      do {
        bVar6 = bVar1;
        if (uVar8 < uVar2) {
          *pbVar3 = bVar1;
          pbVar3 = pbVar3 + 1;
          bVar6 = bVar5;
        }
        uVar9 = uVar9 - 1;
        uVar8 = uVar8 + 1;
        bVar5 = bVar6;
      } while (uVar9 != 0);
      uVar4 = uVar4 + uVar12;
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar3;
    *(ulong *)(this + 8) = uVar2;
    *(ulong *)(this + 0x10) = uVar4;
    this[0x18] = bVar6;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    bVar6 = this[0x18];
    uVar13 = uVar13 - uVar12;
    if (uVar13 == 0) goto LAB_001583ae;
    lVar11 = (uVar7 + uVar12) - uVar10;
    uVar7 = uVar4;
    do {
      bVar5 = bVar1;
      if (uVar7 < uVar2) {
        *pbVar3 = bVar1;
        pbVar3 = pbVar3 + 1;
        bVar5 = bVar6;
      }
      bVar6 = bVar5;
      uVar7 = uVar7 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar2 = *(ulong *)(this + 8);
      uVar4 = *(ulong *)(this + 0x10);
      bVar6 = this[0x18];
      if (uVar13 != 0) {
        lVar11 = uVar7 - uVar10;
        uVar7 = uVar4;
        bVar5 = bVar6;
        do {
          bVar6 = bVar1;
          if (uVar7 < uVar2) {
            *pbVar3 = bVar1;
            pbVar3 = pbVar3 + 1;
            bVar6 = bVar5;
          }
          uVar7 = uVar7 + 1;
          lVar11 = lVar11 + 1;
          bVar5 = bVar6;
        } while (lVar11 != 0);
        uVar4 = uVar4 + uVar13;
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar3;
      *(ulong *)(this + 8) = uVar2;
      *(ulong *)(this + 0x10) = uVar4;
      this[0x18] = bVar6;
      goto LAB_001582ce;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    bVar6 = this[0x18];
    uVar7 = uVar4;
    bVar5 = bVar6;
    if (uVar13 == 0) goto LAB_001583ae;
    do {
      bVar6 = bVar1;
      if (uVar7 < uVar2) {
        *pbVar3 = bVar1;
        pbVar3 = pbVar3 + 1;
        bVar6 = bVar5;
      }
      lVar11 = lVar11 + 1;
      uVar7 = uVar7 + 1;
      bVar5 = bVar6;
    } while (lVar11 != 0);
  }
  uVar4 = uVar4 + uVar13;
LAB_001583ae:
  *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
    **)this = pbVar3;
  *(ulong *)(this + 8) = uVar2;
  *(ulong *)(this + 0x10) = uVar4;
  this[0x18] = bVar6;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }